

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quic_packet_number.cc
# Opt level: O2

QuicPacketNumber * __thiscall quic::QuicPacketNumber::operator++(QuicPacketNumber *this)

{
  this->packet_number_ = this->packet_number_ + 1;
  return this;
}

Assistant:

QuicPacketNumber& QuicPacketNumber::operator++() {
#ifndef NDEBUG
//  DCHECK(IsInitialized());
//  DCHECK_LT(ToUint64(), std::numeric_limits<uint64_t>::max() - 1);
#endif
  packet_number_++;
  return *this;
}